

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTestPackages.cpp
# Opt level: O2

int __thiscall gl3cts::GL32TestPackage::init(GL32TestPackage *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  TransformFeedbackOverflowQueryTests *this_00;
  
  GL31TestPackage::init(&this->super_GL31TestPackage,ctx);
  this_00 = (TransformFeedbackOverflowQueryTests *)operator_new(0x80);
  TransformFeedbackOverflowQueryTests::TransformFeedbackOverflowQueryTests
            (this_00,&((this->super_GL31TestPackage).super_GL30TestPackage.super_TestPackage.
                      m_packageCtx)->m_context,API_GL_ARB_transform_feedback_overflow_query);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
  return extraout_EAX;
}

Assistant:

void GL32TestPackage::init(void)
{
	// Call init() in parent - this creates context.
	GL31TestPackage::init();

	try
	{
		addChild(new gl3cts::TransformFeedbackOverflowQueryTests(
			getContext(), gl3cts::TransformFeedbackOverflowQueryTests::API_GL_ARB_transform_feedback_overflow_query));
	}
	catch (...)
	{
		// Destroy context.
		TestPackage::deinit();
		throw;
	}
}